

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArgumentParser.h
# Opt level: O2

bool __thiscall
cmArgumentParser<void>::Bind<std::__cxx11::string>
          (cmArgumentParser<void> *this,string_view name,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ref)

{
  bool bVar1;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  local_28._8_8_ = 0;
  local_10 = std::
             _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmArgumentParser.h:417:28)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmArgumentParser.h:417:28)>
             ::_M_manager;
  local_28._M_unused._M_object = ref;
  bVar1 = ArgumentParser::Base::MaybeBind(&this->super_Base,name,(KeywordAction *)&local_28);
  std::_Function_base::~_Function_base((_Function_base *)&local_28);
  return bVar1;
}

Assistant:

bool Bind(cm::string_view name, T& ref)
  {
    return this->MaybeBind(name,
                           [&ref](Instance& instance) { instance.Bind(ref); });
  }